

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcmap.c
# Opt level: O2

void tt_cmap4_next(TT_CMap4 cmap)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  FT_Face pFVar4;
  long lVar5;
  FT_CharMap *ppFVar6;
  FT_Int FVar7;
  ushort *puVar8;
  ushort uVar9;
  FT_UInt FVar10;
  FT_UInt32 FVar11;
  uint uVar12;
  
  if (cmap->cur_charcode < 0xffff) {
    pFVar4 = (cmap->cmap).cmap.charmap.face;
    lVar5 = *(long *)&pFVar4[3].num_charmaps;
    ppFVar6 = pFVar4[3].charmaps;
    uVar12 = cmap->cur_charcode + 1;
    do {
      uVar1 = cmap->cur_start;
      if (uVar12 <= uVar1) {
        uVar12 = uVar1;
      }
      uVar2 = cmap->cur_end;
      if (uVar12 <= uVar2) {
        iVar3 = cmap->cur_delta;
        if (cmap->cur_values == (FT_Byte *)0x0) {
          do {
            uVar1 = uVar12 + iVar3;
            FVar10 = uVar1 & 0xffff;
            if (FVar10 < (uint)pFVar4->num_glyphs) {
              FVar11 = uVar12;
              if (FVar10 != 0) goto LAB_0020d68b;
            }
            else {
              FVar11 = -iVar3;
              if ((-1 < (int)uVar1 || (int)(iVar3 + uVar2) < 0) &&
                 ((0xffff < (int)uVar1 || (FVar11 = 0x10000 - iVar3, (int)(iVar3 + uVar2) < 0x10000)
                  ))) break;
            }
            uVar12 = FVar11 + 1;
          } while (uVar12 <= uVar2);
        }
        else {
          puVar8 = (ushort *)(cmap->cur_values + (uVar12 - uVar1) * 2);
          if (puVar8 <= (ushort *)(lVar5 + (long)ppFVar6)) {
            do {
              uVar9 = *puVar8 << 8 | *puVar8 >> 8;
              if ((uVar9 != 0) && (FVar10 = (uint)uVar9 + iVar3 & 0xffff, FVar10 != 0))
              goto LAB_0020d68b;
              uVar12 = uVar12 + 1;
              puVar8 = puVar8 + 1;
            } while (uVar12 <= uVar2);
          }
        }
      }
      FVar7 = tt_cmap4_set_range(cmap,cmap->cur_range + 1);
    } while (-1 < FVar7);
  }
  uVar12 = 0xffffffff;
  FVar10 = 0;
LAB_0020d68b:
  cmap->cur_charcode = uVar12;
  cmap->cur_gindex = FVar10;
  return;
}

Assistant:

static void
  tt_cmap4_next( TT_CMap4  cmap )
  {
    TT_Face   face  = (TT_Face)cmap->cmap.cmap.charmap.face;
    FT_Byte*  limit = face->cmap_table + face->cmap_size;

    FT_UInt  charcode;


    if ( cmap->cur_charcode >= 0xFFFFUL )
      goto Fail;

    charcode = (FT_UInt)cmap->cur_charcode + 1;

    if ( charcode < cmap->cur_start )
      charcode = cmap->cur_start;

    for (;;)
    {
      FT_Byte*  values = cmap->cur_values;
      FT_UInt   end    = cmap->cur_end;
      FT_Int    delta  = cmap->cur_delta;


      if ( charcode <= end )
      {
        if ( values )
        {
          FT_Byte*  p = values + 2 * ( charcode - cmap->cur_start );


          /* if p > limit, the whole segment is invalid */
          if ( p > limit )
            goto Next_Segment;

          do
          {
            FT_UInt  gindex = FT_NEXT_USHORT( p );


            if ( gindex )
            {
              gindex = (FT_UInt)( (FT_Int)gindex + delta ) & 0xFFFFU;
              if ( gindex )
              {
                cmap->cur_charcode = charcode;
                cmap->cur_gindex   = gindex;
                return;
              }
            }
          } while ( ++charcode <= end );
        }
        else
        {
          do
          {
            FT_UInt  gindex = (FT_UInt)( (FT_Int)charcode + delta ) & 0xFFFFU;


            if ( gindex >= (FT_UInt)face->root.num_glyphs )
            {
              /* we have an invalid glyph index; if there is an overflow, */
              /* we can adjust `charcode', otherwise the whole segment is */
              /* invalid                                                  */
              gindex = 0;

              if ( (FT_Int)charcode + delta < 0 &&
                   (FT_Int)end + delta >= 0     )
                charcode = (FT_UInt)( -delta );

              else if ( (FT_Int)charcode + delta < 0x10000L &&
                        (FT_Int)end + delta >= 0x10000L     )
                charcode = (FT_UInt)( 0x10000L - delta );

              else
                goto Next_Segment;
            }

            if ( gindex )
            {
              cmap->cur_charcode = charcode;
              cmap->cur_gindex   = gindex;
              return;
            }
          } while ( ++charcode <= end );
        }
      }

    Next_Segment:
      /* we need to find another range */
      if ( tt_cmap4_set_range( cmap, cmap->cur_range + 1 ) < 0 )
        break;

      if ( charcode < cmap->cur_start )
        charcode = cmap->cur_start;
    }

  Fail:
    cmap->cur_charcode = (FT_UInt32)0xFFFFFFFFUL;
    cmap->cur_gindex   = 0;
  }